

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlog_is_on.cc
# Opt level: O2

int google::SetVLOGLevel(char *module_pattern,int log_level)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined8 *puVar1;
  bool bVar2;
  bool bVar3;
  size_t patt_len;
  char *pcVar4;
  int iVar5;
  long *plVar6;
  size_type *psVar7;
  
  iVar5 = fLI::FLAGS_v;
  patt_len = strlen(module_pattern);
  std::mutex::lock((mutex *)vmodule_mutex);
  bVar3 = false;
  psVar7 = (size_type *)&vmodule_list;
  while (__lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*psVar7,
        __lhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = std::operator==(__lhs,module_pattern);
    if (bVar2) {
      if (!bVar3) {
        iVar5 = *(int *)&__lhs[1]._M_dataplus._M_p;
        bVar3 = true;
      }
      *(int *)&__lhs[1]._M_dataplus._M_p = log_level;
    }
    else if ((!bVar3) &&
            (bVar2 = glog_internal_namespace_::SafeFNMatch_
                               ((__lhs->_M_dataplus)._M_p,__lhs->_M_string_length,module_pattern,
                                patt_len), bVar2)) {
      iVar5 = *(int *)&__lhs[1]._M_dataplus._M_p;
      bVar3 = true;
    }
    psVar7 = &__lhs[1]._M_string_length;
  }
  if (!bVar3) {
    pcVar4 = (char *)operator_new(0x30);
    *(char **)pcVar4 = pcVar4 + 0x10;
    pcVar4[8] = '\0';
    pcVar4[9] = '\0';
    pcVar4[10] = '\0';
    pcVar4[0xb] = '\0';
    pcVar4[0xc] = '\0';
    pcVar4[0xd] = '\0';
    pcVar4[0xe] = '\0';
    pcVar4[0xf] = '\0';
    pcVar4[0x10] = '\0';
    std::__cxx11::string::assign(pcVar4);
    *(int *)(pcVar4 + 0x20) = log_level;
    *(char **)(pcVar4 + 0x28) = vmodule_list;
    plVar6 = &cached_site_list;
    vmodule_list = pcVar4;
    while (puVar1 = (undefined8 *)*plVar6, puVar1 != (undefined8 *)0x0) {
      bVar3 = glog_internal_namespace_::SafeFNMatch_
                        (module_pattern,patt_len,(char *)puVar1[1],puVar1[2]);
      if (bVar3) {
        *puVar1 = pcVar4 + 0x20;
        *plVar6 = puVar1[3];
      }
      else {
        plVar6 = puVar1 + 3;
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)vmodule_mutex);
  if (SetVLOGLevel::vlocal__.level == (int32 *)0x0) {
    bVar3 = InitVLOG3__(&SetVLOGLevel::vlocal__,&fLI::FLAGS_v,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/vlog_is_on.cc"
                        ,1);
    if (!bVar3) {
      return iVar5;
    }
  }
  else if (*SetVLOGLevel::vlocal__.level < 1) {
    return iVar5;
  }
  RawLog__(GLOG_INFO,
           "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/vlog_is_on.cc"
           ,199,"Set VLOG level for \"%s\" to %d",module_pattern,log_level);
  return iVar5;
}

Assistant:

int SetVLOGLevel(const char* module_pattern, int log_level) {
  int result = FLAGS_v;
  size_t const pattern_len = strlen(module_pattern);
  bool found = false;
  {
    std::lock_guard<std::mutex> l(
        vmodule_mutex);  // protect whole read-modify-write
    for (const VModuleInfo* info = vmodule_list; info != nullptr;
         info = info->next) {
      if (info->module_pattern == module_pattern) {
        if (!found) {
          result = info->vlog_level;
          found = true;
        }
        info->vlog_level = log_level;
      } else if (!found && SafeFNMatch_(info->module_pattern.c_str(),
                                        info->module_pattern.size(),
                                        module_pattern, pattern_len)) {
        result = info->vlog_level;
        found = true;
      }
    }
    if (!found) {
      auto* info = new VModuleInfo;
      info->module_pattern = module_pattern;
      info->vlog_level = log_level;
      info->next = vmodule_list;
      vmodule_list = info;

      SiteFlag** item_ptr = &cached_site_list;
      SiteFlag* item = cached_site_list;

      // We traverse the list fully because the pattern can match several items
      // from the list.
      while (item) {
        if (SafeFNMatch_(module_pattern, pattern_len, item->base_name,
                         item->base_len)) {
          // Redirect the cached value to its module override.
          item->level = &info->vlog_level;
          *item_ptr = item->next;  // Remove the item from the list.
        } else {
          item_ptr = &item->next;
        }
        item = *item_ptr;
      }
    }
  }
  RAW_VLOG(1, "Set VLOG level for \"%s\" to %d", module_pattern, log_level);
  return result;
}